

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

ULONG __thiscall
Js::ScriptContext::GetParseFlags
          (ScriptContext *this,LoadScriptFlag loadScriptFlag,Utf8SourceInfo *pSourceInfo,
          SourceContextInfo *sourceContextInfo)

{
  bool bVar1;
  uint uVar2;
  charcount_t cVar3;
  ULONG UVar4;
  ScriptConfiguration *this_00;
  uint local_2c;
  ULONG grfscr;
  SourceContextInfo *sourceContextInfo_local;
  Utf8SourceInfo *pSourceInfo_local;
  LoadScriptFlag loadScriptFlag_local;
  ScriptContext *this_local;
  
  uVar2 = 0;
  if ((loadScriptFlag & LoadScriptFlag_Expression) == LoadScriptFlag_Expression) {
    uVar2 = 2;
  }
  local_2c = uVar2 | 0x1000;
  if ((loadScriptFlag & LoadScriptFlag_CreateParserState) == LoadScriptFlag_CreateParserState) {
    local_2c = uVar2 | 0x1100;
  }
  uVar2 = local_2c;
  if ((loadScriptFlag & LoadScriptFlag_disableDeferredParse) != LoadScriptFlag_disableDeferredParse)
  {
    cVar3 = Utf8SourceInfo::GetCchLength(pSourceInfo);
    bVar1 = SourceContextInfo::IsSourceProfileLoaded(sourceContextInfo);
    UVar4 = Parser::GetDeferralThreshold(bVar1);
    uVar2 = local_2c | 0x10;
    if (UVar4 < cVar3) {
      uVar2 = local_2c | 0x18;
    }
  }
  local_2c = uVar2;
  if ((loadScriptFlag & LoadScriptFlag_StrictMode) == LoadScriptFlag_StrictMode) {
    local_2c = local_2c | 0x40;
  }
  if ((loadScriptFlag & LoadScriptFlag_disableAsmJs) == LoadScriptFlag_disableAsmJs) {
    local_2c = local_2c | 0x4000;
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ea41a0,EvalCompilePhase);
  if (bVar1) {
    local_2c = local_2c | 0xc00;
  }
  if ((loadScriptFlag & LoadScriptFlag_isByteCodeBufferForLibrary) ==
      LoadScriptFlag_isByteCodeBufferForLibrary) {
    local_2c = local_2c | 0x8000;
  }
  if ((loadScriptFlag & LoadScriptFlag_Module) == LoadScriptFlag_Module) {
    this_00 = GetConfig(this);
    bVar1 = ScriptConfiguration::IsES6ModuleEnabled(this_00);
    if (bVar1) {
      local_2c = local_2c | 0x2000;
    }
  }
  if ((loadScriptFlag & LoadScriptFlag_LibraryCode) == LoadScriptFlag_LibraryCode) {
    local_2c = local_2c | 0x20000;
  }
  return local_2c;
}

Assistant:

ULONG ScriptContext::GetParseFlags(LoadScriptFlag loadScriptFlag, Utf8SourceInfo* pSourceInfo, SourceContextInfo* sourceContextInfo)
    {
        // TODO: yongqu handle non-global code.
        ULONG grfscr = fscrGlobalCode | ((loadScriptFlag & LoadScriptFlag_Expression) == LoadScriptFlag_Expression ? fscrReturnExpression : 0);

        if ((loadScriptFlag & LoadScriptFlag_CreateParserState) == LoadScriptFlag_CreateParserState)
        {
            grfscr |= fscrCreateParserState;
        }

        if((loadScriptFlag & LoadScriptFlag_disableDeferredParse) != LoadScriptFlag_disableDeferredParse)
        {
            grfscr |= fscrCanDeferFncParse;
            if(pSourceInfo->GetCchLength() > Parser::GetDeferralThreshold(sourceContextInfo->IsSourceProfileLoaded()))
            {
                grfscr |= fscrWillDeferFncParse;
            }
        }

        if ((loadScriptFlag & LoadScriptFlag_StrictMode) == LoadScriptFlag_StrictMode)
        {
            grfscr |= fscrUseStrictMode;
        }

        if ((loadScriptFlag & LoadScriptFlag_disableAsmJs) == LoadScriptFlag_disableAsmJs)
        {
            grfscr |= fscrNoAsmJs;
        }

        if (PHASE_FORCE1(Js::EvalCompilePhase))
        {
            // pretend it is eval
            grfscr |= (fscrEval | fscrEvalCode);
        }

        if ((loadScriptFlag & LoadScriptFlag_isByteCodeBufferForLibrary) == LoadScriptFlag_isByteCodeBufferForLibrary)
        {
            grfscr |= fscrNoPreJit;
        }

        if (((loadScriptFlag & LoadScriptFlag_Module) == LoadScriptFlag_Module) &&
            GetConfig()->IsES6ModuleEnabled())
        {
            grfscr |= fscrIsModuleCode;
        }

        if ((loadScriptFlag & LoadScriptFlag_LibraryCode) == LoadScriptFlag_LibraryCode)
        {
            grfscr |= fscrIsLibraryCode;
        }

        return grfscr;
    }